

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lasreaditemcompressed_v1.cpp
# Opt level: O2

void __thiscall
LASreadItemCompressed_POINT10_v1::LASreadItemCompressed_POINT10_v1
          (LASreadItemCompressed_POINT10_v1 *this,ArithmeticDecoder *dec)

{
  U8 *pUVar1;
  IntegerCompressor *pIVar2;
  ArithmeticModel *pAVar3;
  long lVar4;
  
  (this->super_LASreadItemCompressed).super_LASreadItem._vptr_LASreadItem =
       (_func_int **)&PTR_read_0015f778;
  this->last_item[0] = '\0';
  this->last_item[1] = '\0';
  this->last_item[2] = '\0';
  this->last_item[3] = '\0';
  this->last_item[4] = '\0';
  this->last_item[5] = '\0';
  this->last_item[6] = '\0';
  this->last_item[7] = '\0';
  this->last_item[8] = '\0';
  this->last_item[9] = '\0';
  this->last_item[10] = '\0';
  this->last_item[0xb] = '\0';
  this->last_item[0xc] = '\0';
  this->last_item[0xd] = '\0';
  this->last_item[0xe] = '\0';
  this->last_item[0xf] = '\0';
  *(undefined8 *)(this->last_item + 0x10) = 0;
  this->last_x_diff[1] = 0;
  this->last_x_diff[2] = 0;
  *(undefined8 *)(this->last_x_diff + 2) = 0;
  this->last_y_diff[1] = 0;
  this->last_y_diff[2] = 0;
  if (dec != (ArithmeticDecoder *)0x0) {
    this->dec = dec;
    this->last_incr = 0;
    pIVar2 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar2,dec,0x20,1,8,0);
    this->ic_dx = pIVar2;
    pIVar2 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar2,dec,0x20,0x14,8,0);
    this->ic_dy = pIVar2;
    pIVar2 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar2,dec,0x20,0x14,8,0);
    this->ic_z = pIVar2;
    pIVar2 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar2,dec,0x10,1,8,0);
    this->ic_intensity = pIVar2;
    pIVar2 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar2,dec,8,2,8,0);
    this->ic_scan_angle_rank = pIVar2;
    pIVar2 = (IntegerCompressor *)operator_new(0x48);
    IntegerCompressor::IntegerCompressor(pIVar2,dec,0x10,1,8,0);
    this->ic_point_source_ID = pIVar2;
    pAVar3 = ArithmeticDecoder::createSymbolModel(dec,0x40);
    this->m_changed_values = pAVar3;
    for (lVar4 = -0x800; lVar4 != 0; lVar4 = lVar4 + 8) {
      *(undefined8 *)((long)this->m_classification + lVar4) = 0;
      *(undefined8 *)((long)this->m_user_data + lVar4) = 0;
      pUVar1 = this[1].last_item + lVar4 + -0x10;
      pUVar1[0] = '\0';
      pUVar1[1] = '\0';
      pUVar1[2] = '\0';
      pUVar1[3] = '\0';
      pUVar1[4] = '\0';
      pUVar1[5] = '\0';
      pUVar1[6] = '\0';
      pUVar1[7] = '\0';
    }
    return;
  }
  __assert_fail("dec",
                "/workspace/llm4binary/github/license_c_cmakelists/LASzip[P]LASzip/src/lasreaditemcompressed_v1.cpp"
                ,0x41,
                "LASreadItemCompressed_POINT10_v1::LASreadItemCompressed_POINT10_v1(ArithmeticDecoder *)"
               );
}

Assistant:

LASreadItemCompressed_POINT10_v1::LASreadItemCompressed_POINT10_v1(ArithmeticDecoder* dec)
{
  U32 i;

  /* set decoder */
  assert(dec);
  this->dec = dec;

  last_incr = 0;

  /* create models and integer compressors */
  ic_dx = new IntegerCompressor(dec, 32);  // 32 bits, 1 context
  ic_dy = new IntegerCompressor(dec, 32, 20); // 32 bits, 20 contexts
  ic_z = new IntegerCompressor(dec, 32, 20);  // 32 bits, 20 contexts
  ic_intensity = new IntegerCompressor(dec, 16);
  ic_scan_angle_rank = new IntegerCompressor(dec, 8, 2);
  ic_point_source_ID = new IntegerCompressor(dec, 16);
  m_changed_values = dec->createSymbolModel(64);
  for (i = 0; i < 256; i++)
  {
    m_bit_byte[i] = 0;
    m_classification[i] = 0;
    m_user_data[i] = 0;
  }
}